

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void read_data_crc(FILE *fp,DataCrc *crc)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  if (fp != (FILE *)0x0) {
    uVar1 = __isoc99_fscanf(fp,"%8d",crc);
    if (crc->sum_cnt != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        uVar2 = __isoc99_fscanf(fp,"%lx",(long)crc->sum + lVar3);
        uVar1 = uVar1 | uVar2;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 8;
      } while (uVar4 < crc->sum_cnt);
    }
    uVar2 = __isoc99_fscanf(fp,"%08x",&crc->vor);
    if ((uVar2 | uVar1) == 0xffffffff) {
      _mpp_log_l(2,"utils","unexpected EOF found\n","read_data_crc");
      return;
    }
  }
  return;
}

Assistant:

void read_data_crc(FILE *fp, DataCrc *crc)
{
    RK_U32 loop = 0;

    if (fp) {
        RK_S32 ret = 0;
        ret = fscanf(fp, "%8d", &crc->len);
        for (loop = 0; loop < crc->sum_cnt; loop++) {
            ret |= fscanf(fp, "%lx", &crc->sum[loop]);
        }
        ret |= fscanf(fp, "%08x", &crc->vor);
        if (ret == EOF)
            mpp_err_f("unexpected EOF found\n");
    }
}